

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooled_alloc.c
# Opt level: O0

void * pool_alloc(pool_alloc_t *p)

{
  pool_t *ppVar1;
  void *ret;
  pool_t *pool;
  pool_alloc_t *p_local;
  
  if (p->free == (void *)0x0) {
    if ((p->npools == 0) || (ppVar1 = p->pools + (p->npools - 1), 0xfffff < ppVar1->used + p->dsize)
       ) {
      ppVar1 = new_pool(p);
      if (ppVar1 == (pool_t *)0x0) {
        p_local = (pool_alloc_t *)0x0;
      }
      else {
        ppVar1->used = p->dsize;
        p_local = (pool_alloc_t *)ppVar1->pool;
      }
    }
    else {
      p_local = (pool_alloc_t *)((long)ppVar1->pool + ppVar1->used);
      ppVar1->used = p->dsize + ppVar1->used;
    }
  }
  else {
    p_local = (pool_alloc_t *)p->free;
    p->free = *p->free;
  }
  return p_local;
}

Assistant:

void *pool_alloc(pool_alloc_t *p) {
    pool_t *pool;
    void *ret;

    /* Look on free list */
    if (NULL != p->free) {
        ret = p->free;
	p->free = *((void **)p->free);
	return ret;
    }

    /* Look for space in the last pool */
    if (p->npools) {
        pool = &p->pools[p->npools - 1];
        if (pool->used + p->dsize < PSIZE) {
	    ret = ((char *) pool->pool) + pool->used;
	    pool->used += p->dsize;
	    return ret;
	}
    }

    /* Need a new pool */
    pool = new_pool(p);
    if (NULL == pool) return NULL;

    pool->used = p->dsize;
    return pool->pool;
}